

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void loop(void)

{
  char *pcVar1;
  Position PVar2;
  int local_756c;
  undefined1 local_7568 [4];
  int x_2;
  char tmp_2 [10000];
  int local_4e50;
  int local_4e4c;
  int y_1;
  int x_1;
  char tmp_1 [10000];
  int local_272c;
  uint uStack_2728;
  Position pos;
  int z;
  int y;
  int x;
  char tmp [10000];
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              memset(buffer,0,10000);
              fgets(buffer,10000,_stdin);
              pcVar1 = strstr(buffer,"START");
              if (pcVar1 == (char *)0x0) break;
              start();
            }
            pcVar1 = strstr(buffer,"PLACE");
            if (pcVar1 == (char *)0x0) break;
            memset(&y,0,10000);
            __isoc99_sscanf(buffer,"%s %d %d %d",&y,&z,&pos.y,&pos);
            place(z,pos.y,(char)pos.x);
          }
          pcVar1 = strstr(buffer,"DONE");
          if (pcVar1 == (char *)0x0) break;
          done();
        }
        pcVar1 = strstr(buffer,"BEGIN");
        if (pcVar1 == (char *)0x0) break;
        PVar2 = aiBegin(board,1);
        local_272c = PVar2.x;
        uStack_2728 = PVar2.y;
        board[local_272c][(int)uStack_2728] = '\x01';
        printf("%d %d\n",(ulong)PVar2 & 0xffffffff,(ulong)uStack_2728);
        fflush(_stdout);
      }
      pcVar1 = strstr(buffer,"TURN");
      if (pcVar1 == (char *)0x0) break;
      memset(&y_1,0,10000);
      __isoc99_sscanf(buffer,"%s %d %d",&y_1,&local_4e4c,&local_4e50);
      turn(local_4e4c,local_4e50);
    }
    pcVar1 = strstr(buffer,"END");
  } while (pcVar1 == (char *)0x0);
  memset(local_7568,0,10000);
  __isoc99_sscanf(buffer,"%s %d",local_7568,&local_756c);
  end(local_756c);
  return;
}

Assistant:

void loop() {
    while (TRUE) {
        memset(buffer, 0, sizeof(buffer));
        fgets(buffer, MAX_BYTE, stdin);

        if (strstr(buffer, START)) {
            start();
        } else if (strstr(buffer, PLACE)) {
            char tmp[MAX_BYTE] = {0};
            int x, y, z;
            sscanf(buffer, "%s %d %d %d", tmp, &x, &y, &z);
            place(x, y, (char) z);
        } else if (strstr(buffer, DONE)) {
            done();
        } else if (strstr(buffer, BEGIN)) {
            // AI
            struct Position pos = aiBegin((const char (*)[BOARD_SIZE]) board, ME);
            board[pos.x][pos.y] = ME;
            printf("%d %d\n", pos.x, pos.y);
            fflush(stdout);
        } else if (strstr(buffer, TURN)) {
            char tmp[MAX_BYTE] = {0};
            int x, y;
            sscanf(buffer, "%s %d %d", tmp, &x, &y);
            turn(x, y);
        } else if (strstr(buffer, END)) {
            char tmp[MAX_BYTE] = {0};
            int x;
            sscanf(buffer, "%s %d", tmp, &x);
            end(x);
            break;
        }
    }
}